

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_forcingstep.c
# Opt level: O0

int forcingStep_Reset(ARKodeMem ark_mem,sunrealtype tR,N_Vector yR)

{
  int iVar1;
  undefined8 in_RSI;
  ARKodeMem in_RDI;
  undefined8 in_XMM0_Qa;
  SUNErrCode err;
  int retval;
  ARKodeForcingStepMem step_mem;
  ARKodeForcingStepMem *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined8 *puVar2;
  int local_4;
  
  puVar2 = (undefined8 *)0x0;
  local_4 = forcingStep_AccessStepMem
                      ((ARKodeMem)0x0,
                       (char *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffc8);
  if (local_4 == 0) {
    iVar1 = SUNStepper_Reset(in_XMM0_Qa,*puVar2,in_RSI);
    if (iVar1 == 0) {
      iVar1 = SUNStepper_Reset(in_XMM0_Qa,puVar2[1],in_RSI);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        arkProcessError(in_RDI,-0x33,0x85,"forcingStep_Reset",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                        ,"Resetting the second partition SUNStepper failed");
        local_4 = -0x33;
      }
    }
    else {
      arkProcessError(in_RDI,-0x33,0x7d,"forcingStep_Reset",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_forcingstep.c"
                      ,"Resetting the first partition SUNStepper failed");
      local_4 = -0x33;
    }
  }
  return local_4;
}

Assistant:

static int forcingStep_Reset(ARKodeMem ark_mem, sunrealtype tR, N_Vector yR)
{
  ARKodeForcingStepMem step_mem = NULL;
  int retval = forcingStep_AccessStepMem(ark_mem, __func__, &step_mem);
  if (retval != ARK_SUCCESS) { return retval; }

  SUNErrCode err = SUNStepper_Reset(step_mem->stepper[0], tR, yR);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Resetting the first partition SUNStepper failed");
    return ARK_SUNSTEPPER_ERR;
  }

  err = SUNStepper_Reset(step_mem->stepper[1], tR, yR);
  if (err != SUN_SUCCESS)
  {
    arkProcessError(ark_mem, ARK_SUNSTEPPER_ERR, __LINE__, __func__, __FILE__,
                    "Resetting the second partition SUNStepper failed");
    return ARK_SUNSTEPPER_ERR;
  }

  return ARK_SUCCESS;
}